

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

void bmcg_sat_solver_var_set_frozen(bmcg_sat_solver *s,int v,int freeze)

{
  long lVar1;
  
  lVar1 = (long)v;
  *(bool *)(*(long *)((long)s + 0x598) + lVar1) = freeze != 0;
  if (*(char *)((long)s + 0x4e8) == '\x01' && freeze == 0) {
    if (*(char *)((long)s + 0x4e8) == '\0') {
      __assert_fail("use_simplification",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.h"
                    ,0xb1,"void Gluco::SimpSolver::updateElimHeap(Var)");
    }
    if (((v < *(int *)((long)s + 0x578)) && (-1 < *(int *)(*(long *)((long)s + 0x570) + lVar1 * 4)))
       || ((*(char *)(*(long *)((long)s + 0x598) + lVar1) == '\0' &&
           (((*(int *)((long)s + 0x5b0) < 1 ||
             (*(char *)(*(long *)((long)s + 0x5a8) + lVar1) == '\0')) &&
            ((*(byte *)(*(long *)((long)s + 0x270) + lVar1) & 2) != 0)))))) {
      Gluco::Heap<Gluco::SimpSolver::ElimLt>::update
                ((Heap<Gluco::SimpSolver::ElimLt> *)((long)s + 0x558),v);
      return;
    }
  }
  return;
}

Assistant:

void bmcg_sat_solver_var_set_frozen( bmcg_sat_solver* s, int v, int freeze )
{
    ((Gluco::SimpSolver*)s)->setFrozen(v, freeze != 0);
}